

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromecast.h
# Opt level: O1

bool cc::sendSimple(Connection *conn,Type type,Namespace urn)

{
  uint __val;
  byte bVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  uint uVar5;
  long *plVar6;
  size_type *psVar7;
  ulong uVar8;
  uint uVar9;
  uint __len;
  string local_f0;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  if ((int)type < 5 && (int)urn < 4) {
    if ((type == GetStatus) &&
       (iVar3 = std::__cxx11::string::compare((char *)&mediaSession_abi_cxx11_), iVar3 != 0)) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"urn:x-cast:com.google.cast.media","");
      __val = -s_requestId;
      if (0 < (int)s_requestId) {
        __val = s_requestId;
      }
      __len = 1;
      if (9 < __val) {
        uVar8 = (ulong)__val;
        uVar9 = 4;
        do {
          __len = uVar9;
          uVar5 = (uint)uVar8;
          if (uVar5 < 100) {
            __len = __len - 2;
            goto LAB_00107ff5;
          }
          if (uVar5 < 1000) {
            __len = __len - 1;
            goto LAB_00107ff5;
          }
          if (uVar5 < 10000) goto LAB_00107ff5;
          uVar8 = uVar8 / 10000;
          uVar9 = __len + 4;
        } while (99999 < uVar5);
        __len = __len + 1;
      }
LAB_00107ff5:
      uVar9 = s_requestId >> 0x1f;
      iVar3 = (int)s_requestId >> 0x1f;
      s_requestId = s_requestId + 1;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)iVar3);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)uVar9 + (long)local_50[0]),__len,__val);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x11e551);
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_60 = *plVar6;
        lStack_58 = plVar4[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar6;
        local_70 = (long *)*plVar4;
      }
      local_68 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_a0 = *plVar6;
        lStack_98 = plVar4[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar6;
        local_b0 = (long *)*plVar4;
      }
      local_a8 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_b0,mediaSession_abi_cxx11_);
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_80 = *plVar6;
        lStack_78 = plVar4[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar6;
        local_90 = (long *)*plVar4;
      }
      local_88 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_d0.field_2._M_allocated_capacity = *psVar7;
        local_d0.field_2._8_8_ = plVar4[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar7;
        local_d0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_d0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      bVar2 = sendMessage(conn,&local_f0,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
        return bVar2;
      }
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      return bVar2;
    }
    bVar1 = s_verbose;
    if (type - Ping < 2) {
      s_verbose = 0;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,
               _ZN2cc2nsL7stringsE_rel + *(int *)(_ZN2cc2nsL7stringsE_rel + (ulong)urn * 4),
               (allocator<char> *)&local_90);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,
               _ZZN2cc10sendSimpleERK10ConnectionNS_3msg4TypeENS_2ns9NamespaceEE4msgs_rel +
               *(int *)(_ZZN2cc10sendSimpleERK10ConnectionNS_3msg4TypeENS_2ns9NamespaceEE4msgs_rel +
                       (ulong)type * 4),(allocator<char> *)&local_b0);
    bVar2 = sendMessage(conn,&local_f0,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    s_verbose = bVar1 & 1;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool sendSimple(const Connection &conn, const msg::Type type, const ns::Namespace urn)
{
    static const char *msgs[msg::SimpleMessageCount] = {
        "{\"type\": \"CONNECT\"}",
        "{\"type\": \"PING\"}",
        "{\"type\": \"PONG\"}",
        "{\"type\": \"GET_STATUS\", \"requestId\": 1}",
        "{\"type\": \"MEDIA_STATUS\"}"
    };

    if (urn >= ns::NamespacesCount) {
        return false;
    }
    if (type >= msg::SimpleMessageCount) {
        return false;
    }
    if (type == msg::GetStatus && mediaSession != "") {
        return sendMessage(conn,
                ns::strings[ns::Media],
                "{ "
                " \"type\": \"GET_STATUS\", "
                " \"requestId\": " + std::to_string(s_requestId++) + ", "
                " \"mediaSessionId\": \"" + mediaSession + "\""
                "}"
            );
    }

    const bool wasVerbose = s_verbose;
    if (type == msg::Ping || type == msg::Pong) {
        // too much spam
        s_verbose = false;
    }
    const bool ret = sendMessage(conn, ns::strings[urn], msgs[type]);
    s_verbose = wasVerbose;
    return ret;
}